

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_mode_setting.cpp
# Opt level: O3

spv_result_t spvtools::val::ModeSettingPass(ValidationState_t *_,Instruction *inst)

{
  _Rb_tree_node_base *p_Var1;
  ushort uVar2;
  undefined8 uVar3;
  pointer pIVar4;
  set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_> *this;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint16_t uVar8;
  _Head_base<2UL,_unsigned_int,_false> id;
  ExecutionModel EVar9;
  uint uVar10;
  MemoryModel MVar11;
  AddressingModel AVar12;
  int32_t iVar13;
  ExecutionMode EVar14;
  uint id_00;
  uint id_01;
  Decoration DVar15;
  BuiltIn BVar16;
  Instruction *pIVar17;
  Instruction *pIVar18;
  const_iterator cVar19;
  _Rb_tree_node_base *p_Var20;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var21;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *psVar22;
  _Base_ptr p_Var23;
  difference_type dVar24;
  _Rb_tree_node_base *p_Var25;
  size_type sVar26;
  const_iterator cVar27;
  long lVar28;
  long lVar29;
  spv_result_t sVar30;
  char *pcVar31;
  undefined1 *puVar32;
  size_t index;
  _Rb_tree_header *p_Var33;
  difference_type __n;
  difference_type __n_1;
  ulong uVar34;
  Instruction *i;
  pointer this_00;
  uint64_t x_size;
  uint64_t y_size;
  uint64_t z_size;
  string local_260;
  ValidationState_t *local_240;
  _Head_base<2UL,_unsigned_int,_false> local_238;
  undefined4 uStack_234;
  size_type local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
  *local_218;
  uint64_t local_210;
  undefined1 local_208 [5];
  char local_203;
  spv_result_t local_38;
  
  uVar2 = (inst->inst_).opcode;
  if (uVar2 < 0x10) {
    if (uVar2 == 0xe) {
      MVar11 = ValidationState_t::memory_model(_);
      if ((MVar11 == MemoryModelVulkan) ||
         (bVar5 = EnumSet<spv::Capability>::contains
                            (&_->module_capabilities_,CapabilityVulkanMemoryModel), !bVar5)) {
        bVar5 = spvIsOpenCLEnv(_->context_->target_env);
        if (!bVar5) {
LAB_00649c82:
          bVar5 = spvIsVulkanEnv(_->context_->target_env);
          if (!bVar5) {
            return SPV_SUCCESS;
          }
          AVar12 = ValidationState_t::addressing_model(_);
          if (AVar12 == AddressingModelLogical) {
            return SPV_SUCCESS;
          }
          AVar12 = ValidationState_t::addressing_model(_);
          if (AVar12 == AddressingModelPhysicalStorageBuffer64) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_(&local_260,_,0x121b,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,
                     (char *)CONCAT44(local_260._M_dataplus._M_p._4_4_,
                                      local_260._M_dataplus._M_p._0_4_),local_260._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,
                     "Addressing model must be Logical or PhysicalStorageBuffer64 ",0x3c);
          pcVar31 = "in the Vulkan environment.";
          lVar28 = 0x1a;
          goto LAB_00649d70;
        }
        AVar12 = ValidationState_t::addressing_model(_);
        if ((AVar12 == AddressingModelPhysical32) ||
           (AVar12 = ValidationState_t::addressing_model(_), AVar12 == AddressingModelPhysical64)) {
          MVar11 = ValidationState_t::memory_model(_);
          if (MVar11 == MemoryModelOpenCL) goto LAB_00649c82;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar31 = "Memory model must be OpenCL in the OpenCL environment.";
          lVar28 = 0x36;
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"Addressing model must be Physical32 or Physical64 ",0x32)
          ;
          pcVar31 = "in the OpenCL environment.";
          lVar28 = 0x1a;
        }
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar31 = 
        "VulkanMemoryModelKHR capability must only be specified if the VulkanKHR memory model is used."
        ;
        lVar28 = 0x5d;
      }
      goto LAB_00649dfb;
    }
    if (uVar2 != 0xf) {
      return SPV_SUCCESS;
    }
    id._M_head_impl = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar17 = ValidationState_t::FindDef(_,id._M_head_impl);
    if ((pIVar17 == (Instruction *)0x0) || ((pIVar17->inst_).opcode != 0x36)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"OpEntryPoint Entry Point <id> ",0x1e);
      ValidationState_t::getIdName_abi_cxx11_(&local_260,_,id._M_head_impl);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 (char *)CONCAT44(local_260._M_dataplus._M_p._4_4_,local_260._M_dataplus._M_p._0_4_)
                 ,local_260._M_string_length);
      pcVar31 = " is not a function.";
      lVar28 = 0x13;
      goto LAB_00649d70;
    }
    EVar9 = Instruction::GetOperandAs<spv::ExecutionModel>(inst,0);
    if (EVar9 == ExecutionModelKernel) {
LAB_006499d7:
      pIVar17 = ValidationState_t::FindDef(_,(pIVar17->inst_).type_id);
      if ((pIVar17 != (Instruction *)0x0) && ((pIVar17->inst_).opcode == 0x13)) {
        local_208._0_4_ = id._M_head_impl;
        cVar19 = std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(_->entry_point_to_execution_modes_)._M_h,(key_type_conflict *)local_208);
        local_218 = (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                     *)((long)cVar19.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                              ._M_cur + 0x10);
        bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
        this = local_218;
        if (bVar5) {
          if ((int)EVar9 < 4) {
            if (EVar9 - ExecutionModelTessellationControl < 2) {
              if (cVar19.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                  ._M_cur != (__node_type *)0x0) {
                p_Var25 = *(_Rb_tree_node_base **)
                           ((long)cVar19.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                                  ._M_cur + 0x28);
                p_Var1 = (_Rb_tree_node_base *)
                         ((long)cVar19.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                                ._M_cur + 0x18);
                if (p_Var25 != p_Var1) {
                  uVar34 = 0;
                  p_Var20 = p_Var25;
                  do {
                    uVar34 = uVar34 + (p_Var20[1]._M_color - _S_black < 3);
                    p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20);
                  } while (p_Var20 != p_Var1);
                  if (uVar34 < 2) {
                    lVar28 = 0;
                    p_Var20 = p_Var25;
                    do {
                      if ((p_Var20[1]._M_color < 0x1a) &&
                         ((0x3400000U >> (p_Var20[1]._M_color & 0x1f) & 1) != 0)) {
                        lVar28 = lVar28 + 1;
                      }
                      p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20);
                    } while (p_Var20 != p_Var1);
                    if (lVar28 < 2) {
                      uVar34 = 0;
                      do {
                        uVar34 = uVar34 + ((p_Var25[1]._M_color & ~_S_black) == 4);
                        p_Var25 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var25);
                      } while (p_Var25 != p_Var1);
                      if (uVar34 < 2) goto LAB_0064ae16;
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                      pcVar31 = 
                      "Tessellation execution model entry points can specify at most one of VertexOrderCw or VertexOrderCcw execution modes."
                      ;
                      lVar28 = 0x75;
                    }
                    else {
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                      pcVar31 = 
                      "Tessellation execution model entry points can specify at most one of Triangles, Quads or Isolines execution modes."
                      ;
                      lVar28 = 0x72;
                    }
                  }
                  else {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                    pcVar31 = 
                    "Tessellation execution model entry points can specify at most one of SpacingEqual, SpacingFractionalOdd or SpacingFractionalEven execution modes."
                    ;
                    lVar28 = 0x91;
                  }
                  goto LAB_00649dfb;
                }
              }
            }
            else if (EVar9 == ExecutionModelGeometry) {
              if (cVar19.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                  ._M_cur != (__node_type *)0x0) {
                p_Var25 = *(_Rb_tree_node_base **)
                           ((long)cVar19.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                                  ._M_cur + 0x28);
                p_Var1 = (_Rb_tree_node_base *)
                         ((long)cVar19.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                                ._M_cur + 0x18);
                if (p_Var25 != p_Var1) {
                  lVar28 = 0;
                  p_Var20 = p_Var25;
                  do {
                    lVar28 = lVar28 + (ulong)(p_Var20[1]._M_color - 0x13 < 5);
                    p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20);
                  } while (p_Var20 != p_Var1);
                  if (lVar28 == 1) {
                    lVar28 = 0;
                    do {
                      lVar28 = lVar28 + (ulong)(p_Var25[1]._M_color - 0x1b < 3);
                      p_Var25 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var25);
                    } while (p_Var25 != p_Var1);
                    if (lVar28 != 1) {
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                      pcVar31 = 
                      "Geometry execution model entry points must specify exactly one of OutputPoints, OutputLineStrip or OutputTriangleStrip execution modes."
                      ;
                      lVar28 = 0x87;
                      goto LAB_00649dfb;
                    }
                    goto LAB_0064ae16;
                  }
                }
              }
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar31 = 
              "Geometry execution model entry points must specify exactly one of InputPoints, InputLines, InputLinesAdjacency, Triangles or InputTrianglesAdjacency execution modes."
              ;
              lVar28 = 0xa5;
              goto LAB_00649dfb;
            }
          }
          else {
            if (EVar9 == ExecutionModelMeshEXT) {
              if (cVar19.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                  ._M_cur != (__node_type *)0x0) {
                uVar3 = *(undefined8 *)
                         ((long)cVar19.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                                ._M_cur + 0x28);
                dVar24 = std::
                         count_if<std::_Rb_tree_const_iterator<spv::ExecutionMode>,spvtools::val::(anonymous_namespace)::ValidateEntryPoint(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__9>
                                   (uVar3,(long)cVar19.
                                                super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                                                ._M_cur + 0x18);
                if (dVar24 == 1) {
                  dVar24 = std::
                           count_if<std::_Rb_tree_const_iterator<spv::ExecutionMode>,spvtools::val::(anonymous_namespace)::ValidateEntryPoint(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__10>
                                     (uVar3,(long)cVar19.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                                                  ._M_cur + 0x18);
                  if (dVar24 != 2) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                    pcVar31 = 
                    "MeshEXT execution model entry points must specify both OutputPrimitivesEXT and OutputVertices Execution Modes."
                    ;
                    lVar28 = 0x6e;
                    goto LAB_00649dfb;
                  }
                  goto LAB_0064ae16;
                }
              }
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar31 = 
              "MeshEXT execution model entry points must specify exactly one of OutputPoints, OutputLinesEXT, or OutputTrianglesEXT Execution Modes."
              ;
              lVar28 = 0x85;
              goto LAB_00649dfb;
            }
            if (EVar9 == ExecutionModelFragment) {
              if (cVar19.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                  ._M_cur == (__node_type *)0x0) {
LAB_0064ac31:
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                pcVar31 = 
                "Fragment execution model entry points require either an OriginUpperLeft or OriginLowerLeft execution mode."
                ;
LAB_0064ac50:
                lVar28 = 0x6a;
              }
              else {
                local_208._0_4_ = 7;
                sVar26 = std::
                         set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                         ::count(local_218,(key_type *)local_208);
                if (sVar26 != 0) {
                  local_260._M_dataplus._M_p._0_4_ = 8;
                  sVar26 = std::
                           set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                           ::count(this,(key_type *)&local_260);
                  if (sVar26 != 0) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                    pcVar31 = 
                    "Fragment execution model entry points can only specify one of OriginUpperLeft or OriginLowerLeft execution modes."
                    ;
                    lVar28 = 0x71;
                    goto LAB_00649dfb;
                  }
                }
                local_208._0_4_ = 7;
                sVar26 = std::
                         set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                         ::count(this,(key_type *)local_208);
                if (sVar26 == 0) {
                  local_260._M_dataplus._M_p._0_4_ = 8;
                  sVar26 = std::
                           set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                           ::count(this,(key_type *)&local_260);
                  if (sVar26 == 0) goto LAB_0064ac31;
                }
                p_Var25 = *(_Rb_tree_node_base **)
                           ((long)cVar19.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                                  ._M_cur + 0x28);
                p_Var1 = (_Rb_tree_node_base *)
                         ((long)cVar19.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                                ._M_cur + 0x18);
                if (p_Var25 == p_Var1) goto LAB_0064ae16;
                uVar34 = 0;
                p_Var20 = p_Var25;
                local_240 = _;
                do {
                  uVar34 = uVar34 + (p_Var20[1]._M_color - 0xe < 3);
                  p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20);
                } while (p_Var20 != p_Var1);
                if (uVar34 < 2) {
                  uVar34 = 0;
                  p_Var20 = p_Var25;
                  do {
                    uVar34 = uVar34 + (p_Var20[1]._M_color - 0x14f6 < 6);
                    p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20);
                  } while (p_Var20 != p_Var1);
                  if (uVar34 < 2) {
                    uVar34 = 0;
                    p_Var20 = p_Var25;
                    do {
                      uVar34 = uVar34 + (p_Var20[1]._M_color - 0x13d7 < 3);
                      p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20);
                    } while (p_Var20 != p_Var1);
                    if (uVar34 < 2) {
                      uVar34 = 0;
                      do {
                        uVar34 = uVar34 + (p_Var25[1]._M_color - 0x13da < 3);
                        p_Var25 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var25);
                      } while (p_Var25 != p_Var1);
                      _ = local_240;
                      if (uVar34 < 2) goto LAB_0064ae16;
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_208,local_240,SPV_ERROR_INVALID_DATA,inst
                                );
                      pcVar31 = 
                      "Fragment execution model entry points can specify at most one of StencilRefUnchangedBackAMD, StencilRefLessBackAMD or StencilRefGreaterBackAMD execution modes."
                      ;
                      lVar28 = 0x9f;
                    }
                    else {
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_208,local_240,SPV_ERROR_INVALID_DATA,inst
                                );
                      pcVar31 = 
                      "Fragment execution model entry points can specify at most one of StencilRefUnchangedFrontAMD, StencilRefLessFrontAMD or StencilRefGreaterFrontAMD execution modes."
                      ;
                      lVar28 = 0xa2;
                    }
                  }
                  else {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,local_240,SPV_ERROR_INVALID_DATA,inst);
                    pcVar31 = 
                    "Fragment execution model entry points can specify at most one fragment shader interlock execution mode."
                    ;
                    lVar28 = 0x67;
                  }
                }
                else {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,local_240,SPV_ERROR_INVALID_DATA,inst);
                  pcVar31 = 
                  "Fragment execution model entry points can specify at most one of DepthGreater, DepthLess or DepthUnchanged execution modes."
                  ;
                  lVar28 = 0x7b;
                }
              }
              goto LAB_00649dfb;
            }
          }
        }
LAB_0064ae16:
        bVar5 = spvIsVulkanEnv(_->context_->target_env);
        if ((EVar9 != ExecutionModelGLCompute) || (!bVar5)) {
LAB_0064ae5d:
          local_208._0_4_ = id._M_head_impl;
          cVar27 = std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&(_->entry_point_to_local_size_or_id_)._M_h,(key_type_conflict *)local_208
                         );
          if (cVar27.
              super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::val::Instruction_*>,_false>
              ._M_cur == (__node_type *)0x0) {
            return SPV_SUCCESS;
          }
          local_208._0_4_ = id._M_head_impl;
          cVar27 = std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&(_->entry_point_to_local_size_or_id_)._M_h,(key_type_conflict *)local_208
                         );
          pIVar17 = *(Instruction **)
                     ((long)cVar27.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::val::Instruction_*>,_false>
                            ._M_cur + 0x10);
          if (pIVar17 == (Instruction *)0x0) {
            return SPV_SUCCESS;
          }
          EVar14 = Instruction::GetOperandAs<spv::ExecutionMode>(pIVar17,1);
          uVar10 = Instruction::GetOperandAs<unsigned_int>(pIVar17,2);
          id_00 = Instruction::GetOperandAs<unsigned_int>(pIVar17,3);
          id_01 = Instruction::GetOperandAs<unsigned_int>(pIVar17,4);
          if (EVar14 != ExecutionModeLocalSizeId) {
            if (EVar14 != ExecutionModeLocalSize) {
              return SPV_SUCCESS;
            }
            if (id_00 * uVar10 * id_01 != 0) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,pIVar17);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,
                       "Local Size execution mode must not have a product of zero (X = ",0x3f);
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,", Y = ",6);
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,", Z = ",6);
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,").",2);
            sVar30 = local_38;
            goto LAB_00649e0d;
          }
          bVar5 = ValidationState_t::EvalConstantValUint64(_,uVar10,(uint64_t *)&local_260);
          bVar6 = ValidationState_t::EvalConstantValUint64(_,id_00,(uint64_t *)&local_238);
          bVar7 = ValidationState_t::EvalConstantValUint64(_,id_01,&local_210);
          if (!bVar5) {
            return SPV_SUCCESS;
          }
          if (!bVar6) {
            return SPV_SUCCESS;
          }
          if (!bVar7) {
            return SPV_SUCCESS;
          }
          if (CONCAT44(uStack_234,local_238._M_head_impl) *
              CONCAT44(local_260._M_dataplus._M_p._4_4_,local_260._M_dataplus._M_p._0_4_) *
              local_210 != 0) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,pIVar17);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,
                     "Local Size Id execution mode must not have a product of zero (X = ",0x42);
          std::ostream::_M_insert<unsigned_long>((ulong)local_208);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,", Y = ",6);
          std::ostream::_M_insert<unsigned_long>((ulong)local_208);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,", Z = ",6);
          std::ostream::_M_insert<unsigned_long>((ulong)local_208);
          pcVar31 = ").";
          lVar28 = 2;
          goto LAB_00649dfb;
        }
        if (cVar19.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
            ._M_cur != (__node_type *)0x0) {
          local_208._0_4_ = 0x11;
          sVar26 = std::
                   set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                   ::count(local_218,(key_type *)local_208);
          if (sVar26 != 0) goto LAB_0064ae5d;
        }
        pIVar4 = (_->ordered_instructions_).
                 super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (this_00 = (_->ordered_instructions_).
                       super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_00 != pIVar4;
            this_00 = this_00 + 1) {
          uVar8 = (this_00->inst_).opcode;
          if (uVar8 == 0x47) {
            if (((0x20 < (ulong)((long)(this_00->operands_).
                                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this_00->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start)) &&
                (DVar15 = Instruction::GetOperandAs<spv::Decoration>(this_00,1), DVar15 == BuiltIn))
               && (BVar16 = Instruction::GetOperandAs<spv::BuiltIn>(this_00,2),
                  BVar16 == BuiltInWorkgroupSize)) goto LAB_0064ae5d;
            uVar8 = (this_00->inst_).opcode;
          }
          if ((uVar8 == 0x14b) &&
             (EVar14 = Instruction::GetOperandAs<spv::ExecutionMode>(this_00,1),
             EVar14 == ExecutionModeLocalSizeId)) goto LAB_0064ae5d;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_260,_,0x191a,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   (char *)CONCAT44(local_260._M_dataplus._M_p._4_4_,
                                    local_260._M_dataplus._M_p._0_4_),local_260._M_string_length);
        pcVar31 = 
        "In the Vulkan environment, GLCompute execution model entry points require either the LocalSize or LocalSizeId execution mode or an object decorated with WorkgroupSize must be specified."
        ;
        lVar28 = 0xb9;
        goto LAB_00649d70;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_260,_,0x1219,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 (char *)CONCAT44(local_260._M_dataplus._M_p._4_4_,local_260._M_dataplus._M_p._0_4_)
                 ,local_260._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"OpEntryPoint Entry Point <id> ",0x1e);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_238,_,id._M_head_impl);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)CONCAT44(uStack_234,local_238._M_head_impl),local_230)
      ;
      pcVar31 = "s function return type is not void.";
      lVar28 = 0x23;
    }
    else {
      uVar10 = Instruction::GetOperandAs<unsigned_int>(pIVar17,3);
      pIVar18 = ValidationState_t::FindDef(_,uVar10);
      if ((pIVar18 != (Instruction *)0x0) &&
         ((long)(pIVar18->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pIVar18->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start == 0xc)) goto LAB_006499d7;
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_260,_,0x1219,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 (char *)CONCAT44(local_260._M_dataplus._M_p._4_4_,local_260._M_dataplus._M_p._0_4_)
                 ,local_260._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"OpEntryPoint Entry Point <id> ",0x1e);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_238,_,id._M_head_impl);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)CONCAT44(uStack_234,local_238._M_head_impl),local_230)
      ;
      pcVar31 = "s function parameter count is not zero.";
      lVar28 = 0x27;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar31,lVar28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_234,local_238._M_head_impl) != &local_228) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(uStack_234,local_238._M_head_impl),
                      local_228._M_allocated_capacity + 1);
    }
    puVar32 = (undefined1 *)
              CONCAT44(local_260._M_dataplus._M_p._4_4_,local_260._M_dataplus._M_p._0_4_);
    sVar30 = local_38;
    goto LAB_00649d87;
  }
  if ((uVar2 != 0x10) && (uVar2 != 0x14b)) {
    return SPV_SUCCESS;
  }
  local_238._M_head_impl = Instruction::GetOperandAs<unsigned_int>(inst,0);
  _Var21 = std::
           __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                     ((_->entry_points_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (_->entry_points_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (_Var21._M_current ==
      (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"OpExecutionMode Entry Point <id> ",0x21);
    ValidationState_t::getIdName_abi_cxx11_(&local_260,_,local_238._M_head_impl);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,
               (char *)CONCAT44(local_260._M_dataplus._M_p._4_4_,local_260._M_dataplus._M_p._0_4_),
               local_260._M_string_length);
    pcVar31 = " is not the Entry Point operand of an OpEntryPoint.";
    lVar28 = 0x33;
    goto LAB_00649d70;
  }
  EVar14 = Instruction::GetOperandAs<spv::ExecutionMode>(inst,1);
  if ((inst->inst_).opcode == 0x14b) {
    if ((int)EVar14 < 0x13ce) {
      if (EVar14 - ExecutionModeSubgroupsPerWorkgroupId < 3) goto LAB_00649e38;
    }
    else if ((((EVar14 - ExecutionModeIsApiEntryAMDX < 0x21) &&
              ((0x10000008fU >> ((ulong)(EVar14 - ExecutionModeIsApiEntryAMDX) & 0x3f) & 1) != 0))
             || (EVar14 == ExecutionModeFPFastMathDefault)) ||
            (EVar14 == ExecutionModeMaximumRegistersIdINTEL)) {
LAB_00649e38:
      uVar34 = (long)(inst->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(inst->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
      if (2 < uVar34) {
        index = 2;
        do {
          uVar10 = Instruction::GetOperandAs<unsigned_int>(inst,index);
          pIVar17 = ValidationState_t::FindDef(_,uVar10);
          if (((EVar14 - ExecutionModeIsApiEntryAMDX < 0x21) &&
              ((0x10000008fU >> ((ulong)(EVar14 - ExecutionModeIsApiEntryAMDX) & 0x3f) & 1) != 0))
             || (EVar14 - ExecutionModeSubgroupsPerWorkgroupId < 3)) {
            iVar13 = spvOpcodeIsConstant((uint)(pIVar17->inst_).opcode);
            if (iVar13 == 0) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
              pcVar31 = "For OpExecutionModeId all Extra Operand ids must be constant instructions."
              ;
              lVar28 = 0x4a;
              goto LAB_00649dfb;
            }
          }
          else if (EVar14 == ExecutionModeFPFastMathDefault) {
            if (index == 2) {
              bVar5 = ValidationState_t::IsFloatScalarType(_,uVar10);
              if (!bVar5) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                pcVar31 = "The Target Type operand must be a floating-point scalar type";
                lVar28 = 0x3c;
                goto LAB_00649dfb;
              }
            }
            else {
              ValidationState_t::EvalInt32IfConst
                        ((tuple<bool,_bool,_unsigned_int> *)local_208,_,uVar10);
              if ((local_203 != '\x01') || (local_208[4] == false)) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                pcVar31 = "The Fast Math Default operand must be a non-specialization constant";
                lVar28 = 0x43;
                goto LAB_00649dfb;
              }
              if (0x7ffff < (uint)local_208._0_4_) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                pcVar31 = "The Fast Math Default operand is an invalid bitmask value";
                lVar28 = 0x39;
                goto LAB_00649dfb;
              }
              if ((local_208._0_4_ & 0x10) != 0) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                pcVar31 = "The Fast Math Default operand must not include Fast";
                lVar28 = 0x33;
                goto LAB_00649dfb;
              }
              if ((~local_208._0_4_ & 0x30000) != 0 && 0x3ffff < (uint)local_208._0_4_) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                pcVar31 = 
                "The Fast Math Default operand must include AllowContract and AllowReassoc when AllowTransform is specified"
                ;
                goto LAB_0064ac50;
              }
            }
          }
          index = index + 1;
        } while (uVar34 != index);
      }
      goto LAB_00649f56;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    pcVar31 = 
    "OpExecutionModeId is only valid when the Mode operand is an execution mode that takes Extra Operands that are id operands."
    ;
    lVar28 = 0x7a;
    goto LAB_00649dfb;
  }
  if ((((EVar14 - ExecutionModeIsApiEntryAMDX < 0x21) &&
       ((0x10000008fU >> ((ulong)(EVar14 - ExecutionModeIsApiEntryAMDX) & 0x3f) & 1) != 0)) ||
      (EVar14 - ExecutionModeSubgroupsPerWorkgroupId < 3)) ||
     (EVar14 == ExecutionModeFPFastMathDefault)) {
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar31 = 
    "OpExecutionMode is only valid when the Mode operand is an execution mode that takes no Extra Operands, or takes Extra Operands that are not id operands."
    ;
    lVar28 = 0x98;
    goto LAB_00649dfb;
  }
LAB_00649f56:
  psVar22 = ValidationState_t::GetExecutionModels(_,local_238._M_head_impl);
  if (0x13d6 < (int)EVar14) {
    if ((int)EVar14 < 0x1495) {
      if (5 < EVar14 - ExecutionModeStencilRefUnchangedFrontAMD) {
        if (EVar14 == ExecutionModeQuadDerivativesKHR) {
          p_Var23 = (psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var33 = &(psVar22->_M_t)._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)p_Var23 == p_Var33) goto LAB_0064aa49;
          do {
            if ((p_Var23[1]._M_color & ~_S_black) != 4) {
              if ((_Rb_tree_header *)p_Var23 != p_Var33) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                pcVar31 = 
                "Execution mode can only be used with the Fragment or GLCompute execution model.";
                lVar28 = 0x4f;
                goto LAB_00649dfb;
              }
              break;
            }
            p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
          } while ((_Rb_tree_header *)p_Var23 != p_Var33);
        }
        else if (EVar14 == ExecutionModeRequireFullQuadsKHR) goto switchD_00649f93_caseD_6;
        goto switchD_00649f93_caseD_b;
      }
    }
    else if (5 < EVar14 - ExecutionModePixelInterlockOrderedEXT) {
      if ((EVar14 - ExecutionModeOutputLinesEXT < 0x1e) &&
         ((0x20000003U >> (EVar14 - ExecutionModeOutputLinesEXT & 0x1f) & 1) != 0)) {
        bVar5 = std::
                all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__5>
                          ((psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                           &(psVar22->_M_t)._M_impl.super__Rb_tree_header);
        if (!bVar5) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar31 = "Execution mode can only be used with the MeshEXT or MeshNV execution model.";
          goto LAB_0064a3fe;
        }
        if (((EVar14 != ExecutionModeOutputPrimitivesEXT) ||
            (bVar5 = spvIsVulkanEnv(_->context_->target_env), !bVar5)) ||
           ((bVar5 = EnumSet<spv::Capability>::contains
                               (&_->module_capabilities_,CapabilityMeshShadingEXT), !bVar5 ||
            (uVar10 = Instruction::GetOperandAs<unsigned_int>(inst,2), uVar10 != 0))))
        goto LAB_0064aa49;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_260,_,0x1ca3,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   (char *)CONCAT44(local_260._M_dataplus._M_p._4_4_,
                                    local_260._M_dataplus._M_p._0_4_),local_260._M_string_length);
        pcVar31 = 
        "In mesh shaders using the MeshEXT Execution Model the OutputPrimitivesEXT Execution Mode must be greater than 0"
        ;
        lVar28 = 0x6f;
        goto LAB_00649d70;
      }
      goto switchD_00649f93_caseD_b;
    }
switchD_00649f93_caseD_6:
    p_Var23 = (psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var33 = &(psVar22->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var23 != p_Var33) {
      do {
        if (p_Var23[1]._M_color != 4) {
          if ((_Rb_tree_header *)p_Var23 != p_Var33) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar31 = "Execution mode can only be used with the Fragment execution model.";
            goto LAB_0064a3d5;
          }
          break;
        }
        p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
      } while ((_Rb_tree_header *)p_Var23 != p_Var33);
      goto switchD_00649f93_caseD_b;
    }
    goto LAB_0064aa49;
  }
  switch(EVar14) {
  case ExecutionModeInvocations:
  case ExecutionModeInputPoints:
  case ExecutionModeInputLines:
  case ExecutionModeInputLinesAdjacency:
  case ExecutionModeInputTrianglesAdjacency:
  case ExecutionModeOutputLineStrip:
  case ExecutionModeOutputTriangleStrip:
    p_Var23 = (psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var33 = &(psVar22->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var23 != p_Var33) {
      do {
        if (p_Var23[1]._M_color != 3) {
          if ((_Rb_tree_header *)p_Var23 != p_Var33) goto LAB_0064a3b6;
          break;
        }
        p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
      } while ((_Rb_tree_header *)p_Var23 != p_Var33);
      break;
    }
    goto LAB_0064aa49;
  case ExecutionModeSpacingEqual:
  case ExecutionModeSpacingFractionalEven:
  case ExecutionModeSpacingFractionalOdd:
  case ExecutionModeVertexOrderCw:
  case ExecutionModeVertexOrderCcw:
  case ExecutionModePointMode:
  case ExecutionModeQuads:
  case ExecutionModeIsolines:
    p_Var23 = (psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var33 = &(psVar22->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var23 == p_Var33) goto LAB_0064aa49;
    do {
      if (p_Var23[1]._M_color - 3 < 0xfffffffe) {
        if ((_Rb_tree_header *)p_Var23 != p_Var33) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar31 = "Execution mode can only be used with a tessellation execution model.";
          lVar28 = 0x44;
          goto LAB_00649dfb;
        }
        break;
      }
      p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
    } while ((_Rb_tree_header *)p_Var23 != p_Var33);
    break;
  case ExecutionModePixelCenterInteger:
  case ExecutionModeOriginUpperLeft:
  case ExecutionModeOriginLowerLeft:
  case EarlyFragmentTests:
  case DepthReplacing:
  case DepthGreater:
  case DepthLess:
  case DepthUnchanged:
    goto switchD_00649f93_caseD_6;
  case ExecutionModeXfb:
  case DepthReplacing|ExecutionModeSpacingEqual:
  case 0x20:
  case ExecutionModeInitializer:
  case ExecutionModeFinalizer:
  case ExecutionModeSubgroupSize:
  case ExecutionModeSubgroupsPerWorkgroup:
  case ExecutionModeSubgroupsPerWorkgroupId:
    break;
  case ExecutionModeLocalSize:
  case ExecutionModeLocalSizeId:
    if (((EVar14 == ExecutionModeLocalSizeId) && ((_->features_).env_allow_localsizeid == false)) &&
       (_->options_->allow_localsizeid == false)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar31 = "LocalSizeId mode is not allowed by the current environment.";
      lVar28 = 0x3b;
    }
    else {
      bVar5 = std::
              all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__9>
                        ((psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                         (_Rb_tree_const_iterator<spv::ExecutionModel>)
                         &(psVar22->_M_t)._M_impl.super__Rb_tree_header,(anon_class_8_1_54a397ff)_);
      if (bVar5) goto LAB_0064aa49;
      bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityMeshShadingNV);
      if ((bVar5) ||
         (bVar5 = EnumSet<spv::Capability>::contains
                            (&_->module_capabilities_,CapabilityMeshShadingEXT), bVar5)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar31 = 
        "Execution mode can only be used with a Kernel, GLCompute, MeshNV, MeshEXT, TaskNV or TaskEXT execution model."
        ;
        lVar28 = 0x6d;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar31 = "Execution mode can only be used with a Kernel or GLCompute execution model.";
LAB_0064a3fe:
        lVar28 = 0x4b;
      }
    }
    goto LAB_00649dfb;
  case ExecutionModeLocalSizeHint:
  case ExecutionModeVecTypeHint:
  case ContractionOff:
  case ExecutionModeLocalSizeHintId:
    p_Var23 = (psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var33 = &(psVar22->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var23 == p_Var33) goto LAB_0064aa49;
    do {
      if (p_Var23[1]._M_color != 6) {
        if ((_Rb_tree_header *)p_Var23 != p_Var33) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar31 = "Execution mode can only be used with the Kernel execution model.";
          lVar28 = 0x40;
          goto LAB_00649dfb;
        }
        break;
      }
      p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
    } while ((_Rb_tree_header *)p_Var23 != p_Var33);
    break;
  case ExecutionModeTriangles:
    p_Var23 = (psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var33 = &(psVar22->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var23 == p_Var33) goto LAB_0064aa49;
    do {
      if (p_Var23[1]._M_color - 4 < 0xfffffffd) {
        if ((_Rb_tree_header *)p_Var23 != p_Var33) goto LAB_0064a97b;
        break;
      }
      p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
    } while ((_Rb_tree_header *)p_Var23 != p_Var33);
    break;
  case ExecutionModeOutputVertices:
    bVar5 = std::
            all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__4>
                      ((psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<spv::ExecutionModel>)
                       &(psVar22->_M_t)._M_impl.super__Rb_tree_header,(anon_class_8_1_54a397ff)_);
    if (bVar5) {
      bVar5 = spvIsVulkanEnv(_->context_->target_env);
      if (((bVar5) &&
          (bVar5 = EnumSet<spv::Capability>::contains
                             (&_->module_capabilities_,CapabilityMeshShadingEXT), bVar5)) &&
         (uVar10 = Instruction::GetOperandAs<unsigned_int>(inst,2), uVar10 == 0)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_260,_,0x1ca2,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   (char *)CONCAT44(local_260._M_dataplus._M_p._4_4_,
                                    local_260._M_dataplus._M_p._0_4_),local_260._M_string_length);
        pcVar31 = 
        "In mesh shaders using the MeshEXT Execution Model the OutputVertices Execution Mode must be greater than 0"
        ;
        lVar28 = 0x6a;
        goto LAB_00649d70;
      }
      goto LAB_0064aa49;
    }
    bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityMeshShadingNV);
    if ((bVar5) ||
       (bVar5 = EnumSet<spv::Capability>::contains
                          (&_->module_capabilities_,CapabilityMeshShadingEXT), bVar5)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar31 = 
      "Execution mode can only be used with a Geometry, tessellation, MeshNV or MeshEXT execution model."
      ;
      lVar28 = 0x61;
    }
    else {
LAB_0064a97b:
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar31 = "Execution mode can only be used with a Geometry or tessellation execution model.";
      lVar28 = 0x50;
    }
    goto LAB_00649dfb;
  case ExecutionModeOutputPoints:
    bVar5 = std::
            all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__1>
                      ((psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<spv::ExecutionModel>)
                       &(psVar22->_M_t)._M_impl.super__Rb_tree_header,(anon_class_8_1_54a397ff)_);
    if (bVar5) goto LAB_0064aa49;
    bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityMeshShadingNV);
    if ((bVar5) ||
       (bVar5 = EnumSet<spv::Capability>::contains
                          (&_->module_capabilities_,CapabilityMeshShadingEXT), bVar5)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar31 = 
      "Execution mode can only be used with the Geometry MeshNV or MeshEXT execution model.";
      lVar28 = 0x54;
    }
    else {
LAB_0064a3b6:
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar31 = "Execution mode can only be used with the Geometry execution model.";
LAB_0064a3d5:
      lVar28 = 0x42;
    }
    goto LAB_00649dfb;
  default:
    if ((EVar14 - ExecutionModeNonCoherentColorAttachmentReadEXT < 3) ||
       (EVar14 == EarlyAndLateFragmentTestsAMD)) goto switchD_00649f93_caseD_6;
  }
switchD_00649f93_caseD_b:
  if (EVar14 == ExecutionModeFPFastMathDefault) {
    local_208._0_4_ = local_238._M_head_impl;
    cVar19 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(_->entry_point_to_execution_modes_)._M_h,(key_type_conflict *)local_208);
    if (cVar19.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      lVar28 = *(long *)((long)cVar19.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                               ._M_cur + 0x20);
      if (lVar28 == 0) {
LAB_0064aa04:
        local_208._0_4_ = 0x116d;
        sVar26 = std::
                 set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                 ::count((set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                          *)((long)cVar19.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                                   ._M_cur + 0x10),(key_type *)local_208);
        if (sVar26 == 0) goto LAB_0064aa49;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar31 = 
        "FPFastMathDefault and SignedZeroInfNanPreserve execution modes cannot be applied to the same entry point"
        ;
        lVar28 = 0x68;
      }
      else {
        lVar29 = (long)cVar19.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                       ._M_cur + 0x18;
        do {
          bVar5 = *(uint *)(lVar28 + 0x20) < 0x1f;
          if (!bVar5) {
            lVar29 = lVar28;
          }
          lVar28 = *(long *)(lVar28 + 0x10 + (ulong)bVar5 * 8);
        } while (lVar28 != 0);
        if ((lVar29 == (long)cVar19.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                             ._M_cur + 0x18) || (0x1f < *(uint *)(lVar29 + 0x20)))
        goto LAB_0064aa04;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar31 = 
        "FPFastMathDefault and ContractionOff execution modes cannot be applied to the same entry point"
        ;
        lVar28 = 0x5e;
      }
LAB_00649dfb:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar31,lVar28);
      sVar30 = local_38;
      goto LAB_00649e0d;
    }
  }
LAB_0064aa49:
  bVar5 = spvIsVulkanEnv(_->context_->target_env);
  if (!bVar5) {
    return SPV_SUCCESS;
  }
  if (EVar14 == ExecutionModePixelCenterInteger) {
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    ValidationState_t::VkErrorID_abi_cxx11_(&local_260,_,0x122e,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,
               (char *)CONCAT44(local_260._M_dataplus._M_p._4_4_,local_260._M_dataplus._M_p._0_4_),
               local_260._M_string_length);
    pcVar31 = "In the Vulkan environment, the PixelCenterInteger execution mode must not be used.";
    lVar28 = 0x52;
  }
  else {
    if (EVar14 != ExecutionModeOriginLowerLeft) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    ValidationState_t::VkErrorID_abi_cxx11_(&local_260,_,0x122d,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,
               (char *)CONCAT44(local_260._M_dataplus._M_p._4_4_,local_260._M_dataplus._M_p._0_4_),
               local_260._M_string_length);
    pcVar31 = "In the Vulkan environment, the OriginLowerLeft execution mode must not be used.";
    lVar28 = 0x4f;
  }
LAB_00649d70:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar31,lVar28);
  puVar32 = (undefined1 *)
            CONCAT44(local_260._M_dataplus._M_p._4_4_,local_260._M_dataplus._M_p._0_4_);
  sVar30 = local_38;
LAB_00649d87:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar32 != &local_260.field_2) {
    operator_delete(puVar32,local_260.field_2._M_allocated_capacity + 1);
  }
LAB_00649e0d:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
  if (sVar30 == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return sVar30;
}

Assistant:

spv_result_t ModeSettingPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpEntryPoint:
      if (auto error = ValidateEntryPoint(_, inst)) return error;
      break;
    case spv::Op::OpExecutionMode:
    case spv::Op::OpExecutionModeId:
      if (auto error = ValidateExecutionMode(_, inst)) return error;
      break;
    case spv::Op::OpMemoryModel:
      if (auto error = ValidateMemoryModel(_, inst)) return error;
      break;
    default:
      break;
  }
  return SPV_SUCCESS;
}